

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_jitshared.c
# Opt level: O0

void initfn(function *fn,lua_State *L,Proto *p,char *fname,ravi_compile_options_t *options)

{
  uchar *puVar1;
  ravi_compile_options_t *options_local;
  char *fname_local;
  Proto *p_local;
  lua_State *L_local;
  function *fn_local;
  
  fn->L = L;
  fn->p = p;
  fn->var = 0;
  fn->options = options;
  snprintf(fn->fname,0x1e,"%s",fname);
  puVar1 = (uchar *)calloc((long)p->sizecode,1);
  fn->jmps = puVar1;
  if (p->maxstacksize == '\0') {
    fn->locals = (uchar *)0x0;
  }
  else {
    puVar1 = (uchar *)calloc((ulong)p->maxstacksize,1);
    fn->locals = puVar1;
  }
  membuff_init(&fn->prologue,0x6497);
  membuff_init(&fn->body,0x1000);
  if (options->codegen_type != RAVI_CODEGEN_FUNCTION_ONLY) {
    membuff_add_string(&fn->prologue,
                       "typedef long long size_t;\ntypedef long long ptrdiff_t;\ntypedef long long intptr_t;\ntypedef long long int64_t;\ntypedef unsigned long long uint64_t;\ntypedef int int32_t;\ntypedef unsigned int uint32_t;\ntypedef short int16_t;\ntypedef unsigned short uint16_t;\ntypedef char int8_t;\ntypedef unsigned char uint8_t;\ntypedef size_t lu_mem;\ntypedef ptrdiff_t l_mem;\ntypedef unsigned char lu_byte;\ntypedef uint16_t LuaType;\n#define NULL ((void *)0)\ntypedef struct lua_State lua_State;\n#define LUA_TNONE\t\t(-1)\n#define LUA_TNIL\t\t0\n#define LUA_TBOOLEAN\t\t1\n#define LUA_TLIGHTUSERDATA\t2\n#define LUA_TNUMBER\t\t3\n#define LUA_TSTRING\t\t4\n#define LUA_TTABLE\t\t5\n#define LUA_TFUNCTION\t\t6\n#define LUA_TUSERDATA\t\t7\n#define LUA_TTHREAD\t\t8\n#define LUA_OK  0\ntypedef enum {TM_INDEX,TM_NEWINDEX,TM_GC,\n\tTM_MODE,TM_LEN,TM_EQ,TM_ADD,TM_SUB,TM_MUL,\n\tTM_MOD,TM_POW,TM_DIV,TM_IDIV,TM_BAND,TM_BOR,\n\tTM_BXOR,TM_SHL,TM_SHR,TM_UNM,TM_BNOT,TM_LT,\n\tTM_LE,TM_CONCAT,TM_CALL,TM_N\n} TMS;\ntypedef double lua_Number;\ntypedef int64_t lua_Integer;\ntypedef uint64_t lua_Unsigned;\ntypedef int (*lua_CFunction) (lua_State *L);\ntypedef union {\n\tlua_Number n;\n\tdouble u;\n\tvoid *s;\n\tlua_Integer i;\n\tlong l;\n} L_Umaxalign;\n#define lua_assert(c)\t\t((void)0)\n#define check_exp(c,e)\t\t(e)\n#define lua_longassert(c)\t((void)0)\n#define luai_apicheck(l,e)\tlua_assert(e)\n#define api_check(l,e,msg)\tluai_apicheck(l,(e) && msg)\n#define UNUSED(x)\t((void)(x))\n#define cast(t, exp)\t((t)(exp))\n#define cast_void(i)\tcast(void, (i))\n#define cast_byte(i)\tcast(lu_byte, (i))\n#define cast_num(i)\tcast(lua_Number, (i))\n#define cast_int(i)\tcast(int, (i))\n#define cast_uchar(i)\tcast(unsigned char, (i))\n#define l_castS2U(i)\t((lua_Unsigned)(i))\n#define l_castU2S(i)\t((lua_Integer)(i))\n#define l_noret\t\tvoid\ntypedef unsigned int Instruction;\n#define luai_numidiv(L,a,b)     ((void)L, l_floor(luai_numdiv(L,a,b)))\n#define luai_numdiv(L,a,b)      ((a)/(b))\n#define luai_nummod(L,a,b,m)  \\\n  { (m) = l_mathop(fmod)(a,b); if ((m)*(b) < 0) (m) += (b); }\n#define LUA_TLCL\t(LUA_TFUNCTION | (0 << 4))\n#define LUA_TLCF\t(LUA_TFUNCTION | (1 ..." /* TRUNCATED STRING LITERAL */
                      );
  }
  membuff_add_fstring(&fn->prologue,"extern int %s(lua_State *L);\n",fn->fname);
  membuff_add_fstring(&fn->prologue,"int %s(lua_State *L) {\n",fn->fname);
  membuff_add_string(&fn->prologue,"int error_code = 0;\n");
  membuff_add_string(&fn->prologue,"lua_Integer i = 0;\n");
  membuff_add_string(&fn->prologue,"lua_Integer ic = 0;\n");
  membuff_add_string(&fn->prologue,"lua_Number n = 0.0;\n");
  membuff_add_string(&fn->prologue,"lua_Number nc = 0.0;\n");
  membuff_add_string(&fn->prologue,"int result = 0;\n");
  membuff_add_string(&fn->prologue,"StkId ra = NULL;\n");
  membuff_add_string(&fn->prologue,"StkId rb = NULL;\n");
  membuff_add_string(&fn->prologue,"StkId rc = NULL;\n");
  membuff_add_string(&fn->prologue,"lua_Unsigned ukey = 0;\n");
  membuff_add_string(&fn->prologue,"lua_Integer *iptr = NULL;\n");
  membuff_add_string(&fn->prologue,"lua_Number *nptr = NULL;\n");
  membuff_add_string(&fn->prologue,"RaviArray *t = NULL;\n");
  membuff_add_string(&fn->prologue,"CallInfo *ci = L->ci;\n");
  membuff_add_string(&fn->prologue,"LClosure *cl = clLvalue(ci->func);\n");
  membuff_add_string(&fn->prologue,"TValue *k = cl->p->k;\n");
  membuff_add_string(&fn->prologue,"StkId base = ci->u.l.base;\n");
  return;
}

Assistant:

static void initfn(struct function *fn, struct lua_State *L, struct Proto *p, const char *fname,
                   struct ravi_compile_options_t *options) {
  fn->L = L;
  fn->p = p;
  fn->var = 0;
  fn->options = options;
  snprintf(fn->fname, sizeof fn->fname, "%s", fname);
  fn->jmps = calloc(p->sizecode, sizeof fn->jmps[0]);
  if (p->maxstacksize)
    fn->locals = calloc(p->maxstacksize, sizeof fn->locals[0]);
  else
    fn->locals = NULL;
  membuff_init(&fn->prologue, strlen(Lua_header) + 4096);
  membuff_init(&fn->body, 4096);
  if (!(options->codegen_type == RAVI_CODEGEN_FUNCTION_ONLY))
    membuff_add_string(&fn->prologue, Lua_header);
  membuff_add_fstring(&fn->prologue, "extern int %s(lua_State *L);\n", fn->fname);
  membuff_add_fstring(&fn->prologue, "int %s(lua_State *L) {\n", fn->fname);
  membuff_add_string(&fn->prologue, "int error_code = 0;\n");
  membuff_add_string(&fn->prologue, "lua_Integer i = 0;\n");
  membuff_add_string(&fn->prologue, "lua_Integer ic = 0;\n");
  membuff_add_string(&fn->prologue, "lua_Number n = 0.0;\n");
  membuff_add_string(&fn->prologue, "lua_Number nc = 0.0;\n");
  membuff_add_string(&fn->prologue, "int result = 0;\n");
  membuff_add_string(&fn->prologue, "StkId ra = NULL;\n");
  membuff_add_string(&fn->prologue, "StkId rb = NULL;\n");
  membuff_add_string(&fn->prologue, "StkId rc = NULL;\n");
  membuff_add_string(&fn->prologue, "lua_Unsigned ukey = 0;\n");
  membuff_add_string(&fn->prologue, "lua_Integer *iptr = NULL;\n");
  membuff_add_string(&fn->prologue, "lua_Number *nptr = NULL;\n");
  membuff_add_string(&fn->prologue, "RaviArray *t = NULL;\n");
  // TODO we never set this???
  // ci->callstatus |= CIST_FRESH;  /* fresh invocation of 'luaV_execute" */
  // lua_assert(ci == L->ci);
  membuff_add_string(&fn->prologue, "CallInfo *ci = L->ci;\n");
  membuff_add_string(&fn->prologue, "LClosure *cl = clLvalue(ci->func);\n");
  membuff_add_string(&fn->prologue, "TValue *k = cl->p->k;\n");
  membuff_add_string(&fn->prologue, "StkId base = ci->u.l.base;\n");
}